

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

int nni_url_canonify_uri(char *out)

{
  char cVar1;
  bool bVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  byte bVar5;
  int iVar6;
  ushort **ppuVar7;
  long lVar8;
  bool bVar9;
  _Bool skip;
  int rv;
  uint8_t c;
  size_t dst;
  size_t src;
  char *out_local;
  
  _rv = 0;
  dst = 0;
  while (out[dst] != '\0') {
    if (out[dst] == '%') {
      ppuVar7 = __ctype_b_loc();
      if ((((*ppuVar7)[(int)out[dst + 1]] & 0x1000) == 0) ||
         (ppuVar7 = __ctype_b_loc(), ((*ppuVar7)[(int)out[dst + 2]] & 0x1000) == 0)) {
        return 3;
      }
      uVar3 = url_hex_val(out[dst + 1]);
      uVar4 = url_hex_val(out[dst + 2]);
      bVar5 = uVar3 * '\x10' + uVar4;
      if (((((bVar5 < 0x41) || (0x5a < bVar5)) && ((bVar5 < 0x61 || (0x7a < bVar5)))) &&
          (((bVar5 < 0x30 || (0x39 < bVar5)) && (bVar5 != 0x2e)))) &&
         (((bVar5 != 0x7e && (bVar5 != 0x5f)) && ((bVar5 != 0x2d && (bVar5 < 0x80)))))) {
        out[_rv] = '%';
        iVar6 = toupper((uint)(byte)out[dst + 1]);
        lVar8 = _rv + 2;
        out[_rv + 1] = (char)iVar6;
        iVar6 = toupper((uint)(byte)out[dst + 2]);
        _rv = _rv + 3;
        out[lVar8] = (char)iVar6;
      }
      else {
        out[_rv] = bVar5;
        _rv = _rv + 1;
      }
      dst = dst + 3;
    }
    else {
      out[_rv] = out[dst];
      _rv = _rv + 1;
      dst = dst + 1;
    }
  }
  out[_rv] = '\0';
  _rv = 0;
  dst = 0;
  bVar2 = false;
  while (cVar1 = out[dst], cVar1 != '\0') {
    if ((cVar1 != '/') || (bVar2)) {
      if ((cVar1 == '?') || (cVar1 == '#')) {
        bVar2 = true;
      }
      out[_rv] = cVar1;
      dst = dst + 1;
      _rv = _rv + 1;
    }
    else {
      lVar8 = _rv + 1;
      out[_rv] = '/';
      for (; _rv = lVar8, out[dst] == '/'; dst = dst + 1) {
      }
    }
  }
  out[_rv] = '\0';
  _rv = 0;
  dst = 0;
  bVar2 = false;
LAB_001201f6:
  do {
    cVar1 = out[dst];
    if (cVar1 == '\0') {
      out[_rv] = '\0';
      out_local._4_4_ = url_utf8_validate(out);
      if (out_local._4_4_ == 0) {
        out_local._4_4_ = 0;
      }
      return out_local._4_4_;
    }
    if ((cVar1 != '/') || (bVar2)) {
      if ((cVar1 == '?') || (cVar1 == '#')) {
        bVar2 = true;
      }
      out[_rv] = cVar1;
    }
    else {
      iVar6 = strncmp(out + dst,"/..",3);
      if ((iVar6 == 0) &&
         ((((out[dst + 3] == '\0' || (out[dst + 3] == '#')) || (out[dst + 3] == '?')) ||
          (out[dst + 3] == '/')))) {
        if (_rv != 0) {
          do {
            _rv = _rv + -1;
            bVar9 = false;
            if (_rv != 0) {
              bVar9 = out[_rv] != '/';
            }
          } while (bVar9);
        }
        dst = dst + 3;
        goto LAB_001201f6;
      }
      iVar6 = strncmp(out + dst,"/.",2);
      if ((iVar6 == 0) &&
         (((out[dst + 2] == '\0' || (out[dst + 2] == '#')) ||
          ((out[dst + 2] == '?' || (out[dst + 2] == '/')))))) {
        dst = dst + 2;
        goto LAB_001201f6;
      }
      out[_rv] = '/';
    }
    dst = dst + 1;
    _rv = _rv + 1;
  } while( true );
}

Assistant:

int
nni_url_canonify_uri(char *out)
{
	size_t  src, dst;
	uint8_t c;
	int     rv;
	bool    skip;

	// First pass, convert '%xx' for safe characters to unescaped forms.
	src = dst = 0;
	while ((c = out[src]) != 0) {
		if (c == '%') {
			if ((!isxdigit(out[src + 1])) ||
			    (!isxdigit(out[src + 2]))) {
				return (NNG_EINVAL);
			}
			c = url_hex_val(out[src + 1]);
			c *= 16;
			c += url_hex_val(out[src + 2]);
			// If it's a safe character, decode, otherwise leave
			// it alone.  We also decode valid high-bytes for
			// UTF-8, which will let us validate them and use
			// those characters in file names later.
			if (((c >= 'A') && (c <= 'Z')) ||
			    ((c >= 'a') && (c <= 'z')) ||
			    ((c >= '0') && (c <= '9')) || (c == '.') ||
			    (c == '~') || (c == '_') || (c == '-') ||
			    (c >= 0x80)) {
				out[dst++] = (char) c;
			} else {
				out[dst++] = '%';
				out[dst++] = toupper((uint8_t) out[src + 1]);
				out[dst++] = toupper((uint8_t) out[src + 2]);
			}
			src += 3;
			continue;
		} else {
			out[dst++] = out[src++];
		}
	}
	out[dst] = 0;

	// Second pass, eliminate redundant //.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			out[dst++] = '/';
			while (out[src] == '/') {
				src++;
			}
			continue;
		}
		if ((c == '?') || (c == '#')) {
			skip = true;
		}
		out[dst++] = (char) c;
		src++;
	}
	out[dst] = 0;

	// Second pass, reduce /. and /.. elements, but only in the path.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			if ((strncmp(out + src, "/..", 3) == 0) &&
			    (out[src + 3] == 0 || out[src + 3] == '#' ||
			        out[src + 3] == '?' || out[src + 3] == '/')) {

				if (dst > 0) {
					do {
						dst--;
					} while ((dst) && (out[dst] != '/'));
				}
				src += 3;
				continue;
			}
			if ((strncmp(out + src, "/.", 2) == 0) &&
			    (out[src + 2] == 0 || out[src + 2] == '#' ||
			        out[src + 2] == '?' || out[src + 2] == '/')) {
				src += 2; // just skip over it
				continue;
			}
			out[dst++] = '/';
			src++;
		} else {
			if ((c == '?') || (c == '#')) {
				skip = true;
			}
			out[dst++] = (char) c;
			src++;
		}
	}
	out[dst] = 0;

	// Finally lets make sure that the results are valid UTF-8.
	// This guards against using UTF-8 redundancy to break security.
	if ((rv = url_utf8_validate(out)) != 0) {
		return (rv);
	}

	return (0);
}